

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::errorRespondDelayedMessages(CommonCore *this,string_view estring)

{
  undefined4 index;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  format_args args;
  string_view fmt;
  char *local_1c8;
  size_t local_1c0;
  undefined1 local_1b0 [184];
  char local_f8;
  _Storage<helics::ActionMessage,_false> local_f0;
  char local_38;
  
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
            ((optional<helics::ActionMessage> *)&local_f0._M_value,&this->delayTransmitQueue);
  if (local_38 == '\x01') {
    do {
      index = local_f0._M_value.messageID;
      if ((local_f0._M_value.messageAction | ~priority_null_info_command) == cmd_broker_query) {
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_1c8;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x9;
        local_1c8 = estring._M_str;
        local_1c0 = estring._M_len;
        ::fmt::v11::vformat_abi_cxx11_
                  ((string *)&((_Storage<helics::ActionMessage,_false> *)local_1b0)->_M_value,
                   (v11 *)"#error:{}",fmt,args);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::setDelayedValue(&this->activeQueries,index,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &((_Storage<helics::ActionMessage,_false> *)local_1b0)->_M_value);
        if ((GlobalFederateId *)local_1b0._0_8_ !=
            &(((_Storage<helics::ActionMessage,_false> *)local_1b0)->_M_value).dest_id) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
      }
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
                ((optional<helics::ActionMessage> *)
                 &((_Storage<helics::ActionMessage,_false> *)local_1b0)->_M_value,
                 &this->delayTransmitQueue);
      std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
                ((_Optional_payload_base<helics::ActionMessage> *)&local_f0._M_value,
                 (_Optional_payload_base<helics::ActionMessage> *)
                 &((_Storage<helics::ActionMessage,_false> *)local_1b0)->_M_value);
      if (local_f8 == '\x01') {
        local_f8 = '\0';
        ActionMessage::~ActionMessage
                  (&((_Storage<helics::ActionMessage,_false> *)local_1b0)->_M_value);
      }
    } while (local_38 != '\0');
  }
  return;
}

Assistant:

void CommonCore::errorRespondDelayedMessages(std::string_view estring)
{
    auto msg = delayTransmitQueue.pop();
    while (msg) {
        if ((*msg).action() == CMD_QUERY ||
            (*msg).action() == CMD_BROKER_QUERY) {  // deal with in flight queries that will block
                                                    // unless a response is given
            activeQueries.setDelayedValue((*msg).messageID, fmt::format("#error:{}", estring));
        }
        // else other message which might get into here shouldn't need any action, just drop them
        msg = delayTransmitQueue.pop();
    }
}